

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O2

double __thiscall
agg::trans_double_path::finalize_path(trans_double_path *this,vertex_storage *vertices)

{
  double dVar1;
  vertex_dist **ppvVar2;
  vertex_dist *pvVar3;
  double dVar4;
  uint uVar5;
  vertex_dist *pvVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  
  uVar7 = 0;
  vertex_sequence<agg::vertex_dist,_6U>::close(vertices,0);
  uVar5 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  if (2 < uVar5) {
    ppvVar2 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    uVar8 = uVar5 - 2 & 0x3f;
    dVar9 = ppvVar2[uVar5 - 2 >> 6][uVar8].dist;
    dVar1 = ppvVar2[uVar5 - 3 >> 6][uVar5 - 3 & 0x3f].dist;
    if (dVar9 * 10.0 < dVar1) {
      pvVar6 = ppvVar2[uVar5 - 2 >> 6] + uVar8;
      pvVar3 = ppvVar2[uVar5 - 1 >> 6];
      uVar5 = uVar5 - 1 & 0x3f;
      pvVar6->dist = pvVar3[uVar5].dist;
      pvVar3 = pvVar3 + uVar5;
      dVar4 = pvVar3->y;
      pvVar6->x = pvVar3->x;
      pvVar6->y = dVar4;
      uVar5 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = uVar5 - 1;
        (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar5;
      }
      (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks[uVar5 - 2 >> 6][uVar5 - 2 & 0x3f]
      .dist = dVar9 + dVar1;
    }
  }
  ppvVar2 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
  dVar9 = 0.0;
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    pvVar3 = ppvVar2[uVar7 >> 6];
    dVar1 = pvVar3[uVar7 & 0x3f].dist;
    pvVar3[uVar7 & 0x3f].dist = dVar9;
    dVar9 = dVar1 + dVar9;
  }
  return (double)(uVar5 - 1) / dVar9;
}

Assistant:

double trans_double_path::finalize_path(vertex_storage& vertices)
    {
        unsigned i;
        double dist;
        double d;

        vertices.close(false);
        if(vertices.size() > 2)
        {
            if(vertices[vertices.size() - 2].dist * 10.0 < 
               vertices[vertices.size() - 3].dist)
            {
                d = vertices[vertices.size() - 3].dist + 
                    vertices[vertices.size() - 2].dist;

                vertices[vertices.size() - 2] = 
                    vertices[vertices.size() - 1];

                vertices.remove_last();
                vertices[vertices.size() - 2].dist = d;
            }
        }

        dist = 0;
        for(i = 0; i < vertices.size(); i++)
        {
            vertex_dist& v = vertices[i];
            d = v.dist;
            v.dist = dist;
            dist += d;
        }

        return (vertices.size() - 1) / dist;
    }